

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecQue.h
# Opt level: O0

void Vec_QueClear(Vec_Que_t *p)

{
  int local_14;
  int i;
  Vec_Que_t *p_local;
  
  if (*p->pHeap != -1) {
    __assert_fail("p->pHeap[0] == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x71,"void Vec_QueClear(Vec_Que_t *)");
  }
  local_14 = 1;
  while( true ) {
    if (p->nSize <= local_14) {
      p->nSize = 1;
      return;
    }
    if ((p->pHeap[local_14] < 0) || (p->pOrder[p->pHeap[local_14]] != local_14)) break;
    p->pOrder[p->pHeap[local_14]] = -1;
    p->pHeap[local_14] = -1;
    local_14 = local_14 + 1;
  }
  __assert_fail("p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                ,0x74,"void Vec_QueClear(Vec_Que_t *)");
}

Assistant:

static inline void Vec_QueClear( Vec_Que_t * p )
{
    int i;
    assert( p->pHeap[0] == -1 );
    for ( i = 1; i < p->nSize; i++ )
    {
        assert( p->pHeap[i] >= 0 && p->pOrder[p->pHeap[i]] == i );
        p->pOrder[p->pHeap[i]] = -1;
        p->pHeap[i] = -1;
    }
    p->nSize = 1;
}